

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_print.c
# Opt level: O0

char * pdgui_strnescape(char *dst,size_t dstlen,char *src,size_t srclen)

{
  char cVar1;
  uint uVar2;
  uint local_38;
  int c;
  uint ptout;
  uint ptin;
  size_t srclen_local;
  char *src_local;
  size_t dstlen_local;
  char *dst_local;
  
  c = 0;
  local_38 = 0;
  if ((dst == (char *)0x0) || (src == (char *)0x0)) {
    return (char *)0x0;
  }
  do {
    cVar1 = src[(uint)c];
    if ((((cVar1 == '\\') || (cVar1 == '{')) || (cVar1 == '}')) ||
       ((cVar1 == '[' || (uVar2 = local_38, cVar1 == ']')))) {
      uVar2 = local_38 + 1;
      dst[local_38] = '\\';
      if ((dstlen != 0) && (dstlen <= uVar2)) {
        dst[local_38] = '\0';
        local_38 = uVar2;
LAB_001b1786:
        if ((dstlen != 0) && (dstlen <= local_38)) {
          dst[dstlen - 1] = '\0';
          return dst;
        }
        dst[local_38] = '\0';
        return dst;
      }
    }
    local_38 = uVar2;
    dst[local_38] = cVar1;
    c = c + 1;
    local_38 = local_38 + 1;
    if (((cVar1 == '\0') || ((srclen != 0 && (srclen <= (uint)c)))) ||
       ((dstlen != 0 && (dstlen <= local_38)))) goto LAB_001b1786;
  } while( true );
}

Assistant:

char* pdgui_strnescape(char *dst, size_t dstlen, const char *src, size_t srclen)
{
    unsigned ptin = 0, ptout = 0;
    if(!dst || !src)return 0;
    while(1)
    {
        int c = src[ptin];
        if (c == '\\' || c == '{' || c == '}' || c == '[' || c == ']') {
            dst[ptout++] = '\\';
            if (dstlen && ptout >= dstlen){
                dst[ptout-1] = 0;
                break;
            }
        }
        dst[ptout] = c;
        ptin++;
        ptout++;
        if (c==0) break;
        if (srclen && ptin  >= srclen) break;
        if (dstlen && ptout >= dstlen) break;
    }

    if(!dstlen || ptout < dstlen)
        dst[ptout]=0;
    else
        dst[dstlen-1]=0;

    return dst;
}